

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeHolder::detach(CodeHolder *this,CodeEmitter *emitter)

{
  long lVar1;
  long *in_RSI;
  long in_RDI;
  CodeEmitter *cur;
  CodeEmitter **pPrev;
  Error err;
  uint32_t type;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  long *local_38;
  Error local_30;
  Error local_14;
  
  if (in_RSI == (long *)0x0) {
    local_14 = 3;
  }
  else if (in_RSI[3] == in_RDI) {
    lVar1 = in_RSI[5];
    local_30 = 0;
    if (*(char *)((long)in_RSI + 0x29) == '\0') {
      if ((char)lVar1 == '\x01') {
        (**(code **)(*in_RSI + 0x80))();
      }
      local_30 = (**(code **)(*in_RSI + 0x18))(in_RSI,in_RDI);
    }
    if ((char)lVar1 == '\x01') {
      *(undefined8 *)(in_RDI + 0x20) = 0;
    }
    local_38 = (long *)(in_RDI + 0x18);
    while( true ) {
      if (*local_38 == 0) {
        DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
      }
      if ((long *)*local_38 == in_RSI) break;
      local_38 = (long *)*local_38 + 4;
    }
    *local_38 = in_RSI[4];
    in_RSI[3] = 0;
    in_RSI[4] = 0;
    local_14 = local_30;
  }
  else {
    local_14 = 4;
  }
  return local_14;
}

Assistant:

Error CodeHolder::detach(CodeEmitter* emitter) noexcept {
  if (!emitter)
    return DebugUtils::errored(kErrorInvalidArgument);

  if (emitter->_code != this)
    return DebugUtils::errored(kErrorInvalidState);

  uint32_t type = emitter->getType();
  Error err = kErrorOk;

  // NOTE: We always detach if we were asked to, if error happens during
  // `emitter->onDetach()` we just propagate it, but the CodeEmitter will
  // be detached.
  if (!emitter->_destroyed) {
    if (type == CodeEmitter::kTypeAssembler)
      static_cast<Assembler*>(emitter)->sync();
    err = emitter->onDetach(this);
  }

  // Special case - detach `Assembler`.
  if (type == CodeEmitter::kTypeAssembler)
    _cgAsm = nullptr;

  // Remove from a single-linked list of `CodeEmitter`s.
  CodeEmitter** pPrev = &_emitters;
  for (;;) {
    ASMJIT_ASSERT(*pPrev != nullptr);
    CodeEmitter* cur = *pPrev;

    if (cur == emitter) {
      *pPrev = emitter->_nextEmitter;
      break;
    }

    pPrev = &cur->_nextEmitter;
  }

  emitter->_code = nullptr;
  emitter->_nextEmitter = nullptr;

  return err;
}